

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O2

string * __thiscall
helics::NetworkCommsInterface::getAddress_abi_cxx11_
          (string *__return_storage_ptr__,NetworkCommsInterface *this)

{
  string *__lhs;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  if (((this->PortNumber).super___atomic_base<int>._M_i < 0) &&
     ((this->super_CommsInterface).serverMode == false)) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(this->super_CommsInterface).name);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __lhs = &(this->super_CommsInterface).localTargetAddress;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs
                          ,"tcp://*");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"tcp://0.0.0.0"), bVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"tcp://127.0.0.1",&local_59);
    gmlc::networking::makePortAddress
              (&local_38,&local_58,(this->PortNumber).super___atomic_base<int>._M_i);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,"*");
    if ((!bVar1) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"0.0.0.0"), !bVar1)) {
      gmlc::networking::makePortAddress
                (&local_38,__lhs,(this->PortNumber).super___atomic_base<int>._M_i);
      __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,__str);
      goto LAB_00229749;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"127.0.0.1",&local_59);
    gmlc::networking::makePortAddress
              (&local_38,&local_58,(this->PortNumber).super___atomic_base<int>._M_i);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
LAB_00229749:
  std::__cxx11::string::~string((string *)__str);
  if (this->appendNameToAddress == true) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'/');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(this->super_CommsInterface).name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NetworkCommsInterface::getAddress() const
{
    using gmlc::networking::makePortAddress;

    if ((PortNumber < 0) && (!serverMode)) {
        return name;
    }
    std::string address;
    if ((localTargetAddress == "tcp://*") || (localTargetAddress == "tcp://0.0.0.0")) {
        address = makePortAddress("tcp://127.0.0.1", PortNumber);
    } else if ((localTargetAddress == "*") || (localTargetAddress == "0.0.0.0")) {
        address = makePortAddress("127.0.0.1", PortNumber);
    } else {
        address = makePortAddress(localTargetAddress, PortNumber);
    }
    if (appendNameToAddress) {
        address.push_back('/');
        address.append(name);
    }
    return address;
}